

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Tags::Tag::Clear(Tag *this)

{
  SimpleTag *pSVar1;
  SimpleTag *this_00;
  int iVar2;
  SimpleTag *d;
  Tag *this_local;
  
  while (0 < this->m_simple_tags_count) {
    iVar2 = this->m_simple_tags_count + -1;
    this->m_simple_tags_count = iVar2;
    SimpleTag::Clear(this->m_simple_tags + iVar2);
  }
  pSVar1 = this->m_simple_tags;
  if (pSVar1 != (SimpleTag *)0x0) {
    this_00 = pSVar1 + (long)pSVar1[-1].m_tag_string;
    while (pSVar1 != this_00) {
      this_00 = this_00 + -1;
      SimpleTag::~SimpleTag(this_00);
    }
    operator_delete__(&pSVar1[-1].m_tag_string);
  }
  this->m_simple_tags = (SimpleTag *)0x0;
  this->m_simple_tags_size = 0;
  return;
}

Assistant:

void Tags::Tag::Clear() {
  while (m_simple_tags_count > 0) {
    SimpleTag& d = m_simple_tags[--m_simple_tags_count];
    d.Clear();
  }

  delete[] m_simple_tags;
  m_simple_tags = NULL;

  m_simple_tags_size = 0;
}